

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipc.c
# Opt level: O3

int nn_cipc_create(nn_ep *ep)

{
  nn_fsm *self;
  nn_ctx *ctx;
  int reconnect_ivl_max;
  int reconnect_ivl;
  int local_28;
  int local_24;
  size_t local_20;
  
  self = (nn_fsm *)nn_alloc_(0x7b0);
  if (self == (nn_fsm *)0x0) {
    nn_cipc_create_cold_3();
  }
  else {
    self[1].shutdown_fn = (nn_fsm_fn)ep;
    nn_ep_tran_setup(ep,&nn_cipc_ep_ops,self);
    ctx = nn_ep_getctx(ep);
    nn_fsm_init_root(self,nn_cipc_handler,nn_cipc_shutdown,ctx);
    *(undefined4 *)&self[1].fn = 1;
    nn_usock_init((nn_usock *)&self[1].state,1,self);
    local_20 = 4;
    nn_ep_getopt(ep,0,6,&local_24,&local_20);
    if (local_20 == 4) {
      nn_ep_getopt(ep,0,7,&local_28,&local_20);
      if (local_20 == 4) {
        if (local_28 == 0) {
          local_28 = local_24;
        }
        nn_backoff_init((nn_backoff *)&self[8].shutdown_fn,2,local_24,local_28,self);
        nn_sipc_init((nn_sipc *)&self[10].stopped.item,3,ep,self);
        nn_fsm_start(self);
        return 0;
      }
      goto LAB_00128daa;
    }
  }
  nn_cipc_create_cold_1();
LAB_00128daa:
  nn_cipc_create_cold_2();
}

Assistant:

int nn_cipc_create (struct nn_ep *ep)
{
    struct nn_cipc *self;
    int reconnect_ivl;
    int reconnect_ivl_max;
    size_t sz;

    /*  Allocate the new endpoint object. */
    self = nn_alloc (sizeof (struct nn_cipc), "cipc");
    alloc_assert (self);

    /*  Initialise the structure. */
    self->ep = ep;
    nn_ep_tran_setup (ep, &nn_cipc_ep_ops, self);
    nn_fsm_init_root (&self->fsm, nn_cipc_handler, nn_cipc_shutdown,
        nn_ep_getctx (ep));
    self->state = NN_CIPC_STATE_IDLE;
    nn_usock_init (&self->usock, NN_CIPC_SRC_USOCK, &self->fsm);
    sz = sizeof (reconnect_ivl);
    nn_ep_getopt (ep, NN_SOL_SOCKET, NN_RECONNECT_IVL, &reconnect_ivl, &sz);
    nn_assert (sz == sizeof (reconnect_ivl));
    sz = sizeof (reconnect_ivl_max);
    nn_ep_getopt (ep, NN_SOL_SOCKET, NN_RECONNECT_IVL_MAX,
        &reconnect_ivl_max, &sz);
    nn_assert (sz == sizeof (reconnect_ivl_max));
    if (reconnect_ivl_max == 0)
        reconnect_ivl_max = reconnect_ivl;
    nn_backoff_init (&self->retry, NN_CIPC_SRC_RECONNECT_TIMER,
        reconnect_ivl, reconnect_ivl_max, &self->fsm);
    nn_sipc_init (&self->sipc, NN_CIPC_SRC_SIPC, ep, &self->fsm);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    return 0;
}